

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::getViscTerms
          (Diffusion *this,MultiFab *visc_terms,int src_comp,int comp,Real time,int rho_flag,
          MultiFab **beta,int betaComp)

{
  AmrLevel *this_00;
  initializer_list<amrex::Geometry> iVar1;
  initializer_list<amrex::BoxArray> iVar2;
  initializer_list<amrex::DistributionMapping> iVar3;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> iVar4;
  initializer_list<amrex::MultiFab_*> iVar5;
  initializer_list<amrex::MultiFab_*> iVar6;
  int *piVar7;
  BoxArray *rhs;
  FabFactory<amrex::FArrayBox> *pFVar8;
  Geometry *pGVar9;
  long lVar10;
  FabArrayBase *in_RSI;
  long in_RDI;
  int in_R8D;
  int ngrow;
  EBFArrayBoxFactory *ebfactory;
  MultiFab *weights;
  MLMG mgn;
  MultiFab *rhotime_1;
  MultiFab *rhotime;
  NavierStokesBase *crse_ns;
  MultiFab crsedata;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  MLEBABecLap mlabec;
  EBFArrayBoxFactory **ebf;
  LPInfo info;
  Real b;
  Real a;
  MultiFab s_tmp;
  MultiFab visc_tmp;
  int ng_visc;
  int ng;
  int allthere;
  int *in_stack_fffffffffffff0c8;
  ulong uVar11;
  MLLinOp *a_lp;
  MLEBABecLap *in_stack_fffffffffffff0d0;
  undefined4 in_stack_fffffffffffff0d8;
  int in_stack_fffffffffffff0dc;
  NavierStokesBase *in_stack_fffffffffffff0e0;
  int in_stack_fffffffffffff0e8;
  int in_stack_fffffffffffff0ec;
  Diffusion *in_stack_fffffffffffff0f0;
  MultiFab *in_stack_fffffffffffff0f8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff100;
  BoxArray *in_stack_fffffffffffff108;
  LPInfo *in_stack_fffffffffffff110;
  BoxArray *in_stack_fffffffffffff118;
  MultiFab *in_stack_fffffffffffff120;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_fffffffffffff128;
  MLEBABecLap *in_stack_fffffffffffff130;
  int in_stack_fffffffffffff140;
  undefined4 in_stack_fffffffffffff144;
  Array<BCType,_3> *in_stack_fffffffffffff148;
  MLLinOp *in_stack_fffffffffffff150;
  undefined1 **local_e78;
  undefined1 **local_e60;
  undefined1 *local_db8;
  undefined1 **local_db0;
  undefined8 local_da8;
  undefined1 *local_d80;
  Real RVar12;
  MultiFab *in_stack_fffffffffffff298;
  MultiFab *in_stack_fffffffffffff2a0;
  MultiFab *in_stack_fffffffffffff2a8;
  int in_stack_fffffffffffff2fc;
  int in_stack_fffffffffffff300;
  int in_stack_fffffffffffff304;
  Real in_stack_fffffffffffff308;
  int in_stack_fffffffffffff314;
  MultiFab *in_stack_fffffffffffff318;
  _Head_base<0UL,_amrex::MLLinOp_*,_false> in_stack_fffffffffffff320;
  int in_stack_fffffffffffff330;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff508;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff510;
  MLMG *in_stack_fffffffffffff518;
  int in_stack_fffffffffffff5a0;
  int in_stack_fffffffffffff5a4;
  MultiFab **in_stack_fffffffffffff5a8;
  MultiArray4<double> in_stack_fffffffffffff5b0;
  long local_9d8;
  undefined8 *local_9d0;
  undefined8 local_9c8;
  undefined1 *local_9a0 [2];
  undefined8 *local_990;
  undefined8 local_988;
  undefined8 *local_960;
  undefined1 *local_958 [13];
  undefined8 *local_8f0;
  undefined8 local_8e8;
  undefined1 local_8c0 [200];
  undefined1 *local_7f8;
  undefined8 local_7f0;
  MultiFab *in_stack_fffffffffffff8d0;
  MultiFab *in_stack_fffffffffffff8d8;
  MultiFab *in_stack_fffffffffffff8e0;
  MultiFab *in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff8f4;
  MLCellLinOp *in_stack_fffffffffffff8f8;
  long local_3f8;
  long *local_3f0;
  LPInfo local_3e8;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined1 local_388 [400];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [388];
  undefined4 local_4c;
  undefined4 local_48;
  int local_34;
  FabArrayBase *local_20;
  undefined4 local_c;
  int *local_8;
  
  local_34 = in_R8D;
  local_20 = in_RSI;
  checkBeta((Diffusion *)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
            (MultiFab **)in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
  piVar7 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff0d0,
                      (size_type)in_stack_fffffffffffff0c8);
  if (*piVar7 == 0) {
    amrex::FabArrayBase::nGrow(local_20,0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (in_stack_fffffffffffff100,(value_type)in_stack_fffffffffffff0f8,
               (int)((ulong)in_stack_fffffffffffff0f0 >> 0x20),(int)in_stack_fffffffffffff0f0,
               in_stack_fffffffffffff0ec);
  }
  else {
    local_48 = 1;
    local_4c = 2;
    local_1e8 = 0;
    uStack_1e0 = 0;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_1d8 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x5cbd3f);
    amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff0d0);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_fffffffffffff110,in_stack_fffffffffffff108,
               (DistributionMapping *)in_stack_fffffffffffff100,
               (int)((ulong)in_stack_fffffffffffff0f8 >> 0x20),(int)in_stack_fffffffffffff0f8,
               (MFInfo *)in_stack_fffffffffffff0f0,
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff120);
    amrex::MFInfo::~MFInfo((MFInfo *)0x5cbd9a);
    local_3a8 = 0;
    uStack_3a0 = 0;
    local_3b8 = 0;
    uStack_3b0 = 0;
    local_398 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x5cbdfc);
    rhs = (BoxArray *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff0d0);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_fffffffffffff110,in_stack_fffffffffffff108,
               (DistributionMapping *)in_stack_fffffffffffff100,
               (int)((ulong)in_stack_fffffffffffff0f8 >> 0x20),(int)in_stack_fffffffffffff0f8,
               (MFInfo *)in_stack_fffffffffffff0f0,
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff120);
    amrex::MFInfo::~MFInfo((MFInfo *)0x5cbe57);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff0d0,(value_type)rhs);
    local_3c0 = 0;
    local_3c8 = 0xbff0000000000000;
    amrex::LPInfo::LPInfo(&local_3e8);
    amrex::LPInfo::setAgglomeration(&local_3e8,(anonymous_namespace)::agglomeration != 0);
    amrex::LPInfo::setConsolidation(&local_3e8,(anonymous_namespace)::consolidation != 0);
    amrex::LPInfo::setMaxCoarseningLevel(&local_3e8,0);
    pFVar8 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff0d0);
    local_3f8 = __dynamic_cast(pFVar8,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                               &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (local_3f8 == 0) {
      __cxa_bad_cast();
    }
    local_3f0 = &local_3f8;
    pGVar9 = amrex::AmrLevel::Geom(*(AmrLevel **)(in_RDI + 8));
    memcpy(local_8c0,pGVar9,200);
    local_7f0 = 1;
    local_7f8 = local_8c0;
    std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x5cbf9b);
    iVar1._M_array._4_4_ = in_stack_fffffffffffff0dc;
    iVar1._M_array._0_4_ = in_stack_fffffffffffff0d8;
    iVar1._M_len = (size_type)in_stack_fffffffffffff0e0;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffff0d0,iVar1,(allocator_type *)rhs);
    local_960 = local_958;
    amrex::BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffff0d0,rhs);
    local_8f0 = local_958;
    local_8e8 = 1;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x5cc016);
    iVar2._M_array._4_4_ = in_stack_fffffffffffff0dc;
    iVar2._M_array._0_4_ = in_stack_fffffffffffff0d8;
    iVar2._M_len = (size_type)in_stack_fffffffffffff0e0;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff0d0,iVar2,(allocator_type *)rhs);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)in_stack_fffffffffffff0d0,(DistributionMapping *)rhs);
    local_988 = 1;
    local_990 = local_9a0;
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x5cc08f);
    iVar3._M_array._4_4_ = in_stack_fffffffffffff0dc;
    iVar3._M_array._0_4_ = in_stack_fffffffffffff0d8;
    iVar3._M_len = (size_type)in_stack_fffffffffffff0e0;
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff0d0,iVar3,(allocator_type *)rhs);
    local_9d8 = *local_3f0;
    local_9d0 = &local_9d8;
    local_9c8 = 1;
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x5cc0fa);
    iVar4._M_array._4_4_ = in_stack_fffffffffffff0dc;
    iVar4._M_array._0_4_ = in_stack_fffffffffffff0d8;
    iVar4._M_len = (size_type)in_stack_fffffffffffff0e0;
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)in_stack_fffffffffffff0d0,iVar4,(allocator_type *)rhs);
    uVar11 = CONCAT44((int)((ulong)rhs >> 0x20),1);
    amrex::MLEBABecLap::MLEBABecLap
              (in_stack_fffffffffffff130,in_stack_fffffffffffff128,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff120,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff118,in_stack_fffffffffffff110,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)in_stack_fffffffffffff108,in_stack_fffffffffffff140);
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    ~Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
             *)0x5cc16e);
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::~allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x5cc17b);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x5cc188);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x5cc195);
    local_e60 = (undefined1 **)&local_990;
    do {
      local_e60 = local_e60 + -2;
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x5cc1ca);
    } while (local_e60 != local_9a0);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x5cc1f4);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x5cc201);
    local_e78 = (undefined1 **)&local_8f0;
    do {
      local_e78 = local_e78 + -0xd;
      amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff0d0);
    } while (local_e78 != local_958);
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x5cc260);
    std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x5cc26d);
    amrex::MLLinOp::setMaxOrder((MLLinOp *)&stack0xfffffffffffff830,max_order);
    setDomainBC(in_stack_fffffffffffff0f0,
                (array<amrex::LinOpBCType,_3UL> *)
                CONCAT44(in_stack_fffffffffffff0ec,in_stack_fffffffffffff0e8),
                (array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffff0e0,
                in_stack_fffffffffffff0dc);
    amrex::MLLinOp::setDomainBC
              (in_stack_fffffffffffff150,in_stack_fffffffffffff148,
               (Array<BCType,_3> *)CONCAT44(in_stack_fffffffffffff144,in_stack_fffffffffffff140));
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffff0d0);
    if (0 < *(int *)(in_RDI + 0x20)) {
      this_00 = *(AmrLevel **)(*(long *)(in_RDI + 0x28) + 8);
      amrex::AmrLevel::boxArray(this_00);
      amrex::AmrLevel::DistributionMap(this_00);
      amrex::MFInfo::MFInfo((MFInfo *)0x5cc366);
      pFVar8 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff0d0);
      amrex::MultiFab::define
                (in_stack_fffffffffffff120,in_stack_fffffffffffff118,
                 (DistributionMapping *)in_stack_fffffffffffff110,
                 (int)((ulong)in_stack_fffffffffffff108 >> 0x20),(int)in_stack_fffffffffffff108,
                 (MFInfo *)in_stack_fffffffffffff100,
                 (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff130);
      amrex::MFInfo::~MFInfo((MFInfo *)0x5cc3bd);
      uVar11 = (ulong)pFVar8 & 0xffffffff00000000;
      amrex::AmrLevel::FillPatch
                ((AmrLevel *)in_stack_fffffffffffff320._M_head_impl,in_stack_fffffffffffff318,
                 in_stack_fffffffffffff314,in_stack_fffffffffffff308,in_stack_fffffffffffff304,
                 in_stack_fffffffffffff300,in_stack_fffffffffffff2fc,in_stack_fffffffffffff330);
      if (local_34 == 2) {
        NavierStokesBase::get_rho
                  (in_stack_fffffffffffff0e0,
                   (Real)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
        amrex::MultiFab::Divide
                  ((MultiFab *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8,
                   (int)((ulong)in_stack_fffffffffffff0f0 >> 0x20),(int)in_stack_fffffffffffff0f0,
                   in_stack_fffffffffffff0ec,in_stack_fffffffffffff0e8);
      }
      local_8 = (int *)(in_RDI + 0x3c);
      local_c = 0;
      amrex::MLLinOp::setCoarseFineBC
                ((MLLinOp *)&stack0xfffffffffffff830,(MultiFab *)&stack0xfffffffffffff488,*local_8);
    }
    a_lp = (MLLinOp *)(uVar11 & 0xffffffff00000000);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)in_stack_fffffffffffff320._M_head_impl,in_stack_fffffffffffff318,
               in_stack_fffffffffffff314,in_stack_fffffffffffff308,in_stack_fffffffffffff304,
               in_stack_fffffffffffff300,in_stack_fffffffffffff2fc,in_stack_fffffffffffff330);
    if (local_34 == 2) {
      NavierStokesBase::get_rho
                (in_stack_fffffffffffff0e0,
                 (Real)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8));
      amrex::MultiFab::Divide
                ((MultiFab *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8,
                 (int)((ulong)in_stack_fffffffffffff0f0 >> 0x20),(int)in_stack_fffffffffffff0f0,
                 in_stack_fffffffffffff0ec,in_stack_fffffffffffff0e8);
    }
    amrex::MLCellLinOp::setLevelBC
              (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f4,in_stack_fffffffffffff8e8,
               in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
    amrex::MultiFab::~MultiFab((MultiFab *)0x5cc804);
    amrex::MLEBABecLap::setScalars
              ((MLEBABecLap *)in_stack_fffffffffffff0e0,
               (Real)CONCAT44(in_stack_fffffffffffff0dc,in_stack_fffffffffffff0d8),
               (Real)in_stack_fffffffffffff0d0);
    setBeta((MLEBABecLap *)in_stack_fffffffffffff5b0.hp,in_stack_fffffffffffff5a8,
            in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0);
    amrex::MLMG::MLMG((MLMG *)in_stack_fffffffffffff0d0,a_lp);
    amrex::MLMG::setVerbose((MLMG *)&stack0xfffffffffffff2b0,verbose);
    local_d80 = local_1d0;
    pGVar9 = (Geometry *)&local_d80;
    RVar12 = 4.94065645841247e-324;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x5cc8a9);
    iVar5._M_array._4_4_ = in_stack_fffffffffffff0dc;
    iVar5._M_array._0_4_ = in_stack_fffffffffffff0d8;
    iVar5._M_len = (size_type)in_stack_fffffffffffff0e0;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff0d0,iVar5,(allocator_type *)a_lp);
    local_db8 = local_388;
    local_db0 = &local_db8;
    local_da8 = 1;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x5cc90b);
    iVar6._M_array._4_4_ = in_stack_fffffffffffff0dc;
    iVar6._M_array._0_4_ = in_stack_fffffffffffff0d8;
    iVar6._M_len = (size_type)in_stack_fffffffffffff0e0;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff0d0,iVar6,(allocator_type *)a_lp);
    amrex::MLMG::apply(in_stack_fffffffffffff518,in_stack_fffffffffffff510,in_stack_fffffffffffff508
                      );
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x5cc95b);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x5cc968);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x5cc975);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x5cc982);
    pFVar8 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff0d0);
    lVar10 = __dynamic_cast(pFVar8,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (lVar10 == 0) {
      __cxa_bad_cast();
    }
    amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff0d0);
    amrex::AmrLevel::Geom(*(AmrLevel **)(in_RDI + 8));
    amrex::single_level_weighted_redistribute
              (in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,
               (int)((ulong)RVar12 >> 0x20),SUB84(RVar12,0),pGVar9);
    amrex::MLMG::~MLMG((MLMG *)in_stack_fffffffffffff0d0);
    amrex::MLEBABecLap::~MLEBABecLap(in_stack_fffffffffffff0d0);
    amrex::MultiFab::~MultiFab((MultiFab *)0x5cca70);
    amrex::MultiFab::~MultiFab((MultiFab *)0x5cca7d);
  }
  return;
}

Assistant:

void
Diffusion::getViscTerms (MultiFab&              visc_terms,
                         int                    src_comp,
                         int                    comp,
                         Real                   time,
                         int                    rho_flag,
                         const MultiFab* const* beta,
                         int                    betaComp)
{
    int allthere;
    checkBeta(beta, allthere);
    //
    // Before computing the godunov predictors we may have to
    // precompute the viscous source terms.  To do this we must
    // construct a Laplacian operator, set the coeficients and apply
    // it to the time N data.  First, however, we must precompute the
    // fine N bndry values.  We will do this for each scalar that diffuses.
    //
    // Note: This routine DOES NOT fill grow cells
    //

    //
    // FIXME
    // LinOp classes cannot handle multcomponent MultiFabs yet,
    // construct the components one at a time and copy to visc_terms.
    //

    if (is_diffusive[comp])
    {
        int ng = 1;
        int ng_visc(2);// needed for redistribution
        MultiFab visc_tmp(grids,dmap,1,ng_visc,MFInfo(),navier_stokes->Factory()),
                 s_tmp(grids,dmap,1,ng,MFInfo(),navier_stokes->Factory());
	// not sure this is needed...
        visc_tmp.setVal(0.);
        //
        // Set up operator and apply to compute viscous terms.
        //
        const Real a = 0.0;
        const Real b = -1.0;

	LPInfo info;
	info.setAgglomeration(agglomeration);
	info.setConsolidation(consolidation);
	info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
	const auto& ebf = &(dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory()));
	MLEBABecLap mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
	MLABecLaplacian mlabec({navier_stokes->Geom()},{grids},{dmap},info);
#endif

	mlabec.setMaxOrder(max_order);

	{
	  // set BCs

	  std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
	  std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
	  setDomainBC(mlmg_lobc, mlmg_hibc, comp);

	  mlabec.setDomainBC(mlmg_lobc, mlmg_hibc);

	  MultiFab crsedata;

	  if (level > 0) {
	    auto& crse_ns = *(coarser->navier_stokes);
	    crsedata.define(crse_ns.boxArray(), crse_ns.DistributionMap(), 1, ng,MFInfo(),crse_ns.Factory());
	    AmrLevel::FillPatch(crse_ns,crsedata,ng,time,State_Type,comp,1);
	    if (rho_flag == 2) {
	      // We want to evaluate (div beta grad) S, not rho*S.
	      const MultiFab& rhotime = crse_ns.get_rho(time);
	      MultiFab::Divide(crsedata,rhotime,0,0,1,ng);
	    }
	    mlabec.setCoarseFineBC(&crsedata, crse_ratio[0]);
	  }

	  AmrLevel::FillPatch(*navier_stokes,s_tmp,ng,time,State_Type,comp,1);
	  if (rho_flag == 2) {
	    const MultiFab& rhotime = navier_stokes->get_rho(time);
	    MultiFab::Divide(s_tmp,rhotime,0,0,1,ng);
	  }
	  mlabec.setLevelBC(0, &s_tmp);
	}

	mlabec.setScalars(a,b);
	// mlabec.setACoeffs() not needed since a = 0.0


	setBeta(mlabec, beta, betaComp);

	// Do we need something like this cribbed from mfix???
	// This sets the coefficient on the wall and defines it as a homogeneous
	// Dirichlet bc for the solve. mu_g is the viscosity at cc in mfix
	// matches what's in bcoeff
	//mlabec.setEBHomogDirichlet ( 0, (*mu_g[lev]) );

	MLMG mgn(mlabec);
	mgn.setVerbose(verbose);
	mgn.apply({&visc_tmp},{&s_tmp});

#ifdef AMREX_USE_EB
        const amrex::MultiFab* weights;
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
        weights = &(ebfactory.getVolFrac());

        amrex::single_level_weighted_redistribute(visc_tmp, visc_terms, *weights, comp-src_comp, 1,
                                         navier_stokes->Geom());
#else
	MultiFab::Copy(visc_terms,visc_tmp,0,comp-src_comp,1,0);
#endif

    }
    else
    {
      int ngrow = visc_terms.nGrow();
      visc_terms.setVal(0.0,comp-src_comp,1,ngrow);
    }
}